

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

void __thiscall CVmObjString::CVmObjString(CVmObjString *this,size_t len)

{
  int iVar1;
  undefined4 extraout_var;
  uint16_t tmp;
  
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_003108e8;
  if (len < 0x10000) {
    iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,len + 2,this);
    (this->super_CVmObject).ext_ = (char *)CONCAT44(extraout_var,iVar1);
    *(short *)CONCAT44(extraout_var,iVar1) = (short)len;
    return;
  }
  (this->super_CVmObject).ext_ = (char *)0x0;
  err_throw(0x7ec);
}

Assistant:

CVmObjString::CVmObjString(VMG_ size_t len)
{
    /* 
     *   the length is limited to an unsigned 16-bit value (NB: it really is
     *   65535 on ALL PLATFORMS - this is a portable limit imposed by the
     *   portable storage format, not a local platform limit) 
     */
    if (len > 65535)
    {
        ext_ = 0;
        err_throw(VMERR_STR_TOO_LONG);
    }
    
    /* 
     *   allocate space for the buffer plus the length prefix in the
     *   variable heap 
     */
    ext_ = (char *)G_mem->get_var_heap()->alloc_mem(len + VMB_LEN, this);

    /* set the length */
    vmb_put_len(ext_, len);
}